

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::LoopNestingDepth(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  uint32_t uVar1;
  
  uVar1 = 0xffffffff;
  do {
    bb_id = LoopMergeBlock(this,bb_id);
    uVar1 = uVar1 + 1;
  } while (bb_id != 0);
  return uVar1;
}

Assistant:

uint32_t StructuredCFGAnalysis::LoopNestingDepth(uint32_t bb_id) {
  uint32_t result = 0;

  // Find the merge block of the current loop as long as the block is inside a
  // loop, exiting a loop for each iteration.
  for (uint32_t merge_block_id = LoopMergeBlock(bb_id); merge_block_id != 0;
       merge_block_id = LoopMergeBlock(merge_block_id)) {
    result++;
  }

  return result;
}